

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdqsort.h
# Opt level: O2

pair<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_bool>
pdqsort_detail::
partition_right_branchless<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::less<int>>
          (uint *begin,uint *end,ulong param_3)

{
  uint *puVar1;
  uchar *offsets_l;
  uint uVar2;
  uint uVar3;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var4;
  long lVar5;
  ulong uVar6;
  int __tmp;
  uint *puVar7;
  ulong uVar8;
  char cVar9;
  ulong uVar10;
  ulong extraout_RDX;
  ulong uVar11;
  uint *puVar12;
  long lVar13;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> first;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> last;
  uint *puVar14;
  ulong uVar15;
  pair<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_bool> pVar16;
  uchar offsets_r_storage [128];
  uchar offsets_l_storage [128];
  long local_180;
  byte local_101;
  uchar local_100 [127];
  byte bStack_81;
  uchar local_80 [80];
  
  uVar2 = *begin;
  lVar5 = 0;
  do {
    uVar3 = *(uint *)((long)begin + lVar5 + 4);
    lVar5 = lVar5 + 4;
  } while ((int)uVar3 < (int)uVar2);
  puVar1 = (uint *)((long)begin + lVar5);
  puVar12 = end;
  if (lVar5 == 4) {
    do {
      if (end <= puVar1) break;
      puVar12 = end + -1;
      puVar14 = end + -1;
      end = puVar12;
    } while ((int)uVar2 <= (int)*puVar14);
  }
  else {
    do {
      end = puVar12 + -1;
      puVar14 = puVar12 + -1;
      puVar12 = end;
    } while ((int)uVar2 <= (int)*puVar14);
  }
  puVar12 = puVar1;
  if (puVar1 < end) {
    param_3 = (ulong)*end;
    first._M_current = (int *)((uint *)((long)begin + lVar5) + 1);
    *(uint *)((long)begin + lVar5) = *end;
    *end = uVar3;
    uVar11 = 0;
    uVar15 = 0;
    lVar5 = 0;
    local_180 = 0;
    last._M_current = (int *)end;
    puVar12 = (uint *)first._M_current;
    puVar14 = end;
    while (puVar12 < puVar14) {
      uVar6 = (long)puVar14 - (long)puVar12 >> 2;
      uVar10 = uVar6 >> (uVar15 == 0);
      if (uVar11 != 0) {
        uVar10 = 0;
      }
      uVar6 = uVar6 - uVar10;
      if (uVar15 != 0) {
        uVar6 = 0;
      }
      puVar7 = puVar12;
      if (uVar10 < 0x40) {
        for (uVar8 = 0; uVar10 != uVar8; uVar8 = uVar8 + 1) {
          local_80[uVar11] = (char)uVar8;
          uVar11 = uVar11 + ((int)uVar2 <= (int)*puVar7);
          puVar7 = puVar7 + 1;
        }
      }
      else {
        for (uVar10 = 0; uVar10 < 0x40; uVar10 = uVar10 + 8) {
          cVar9 = (char)uVar10;
          local_80[uVar11] = cVar9;
          lVar13 = ((int)uVar2 <= (int)puVar12[uVar10]) + uVar11;
          local_80[lVar13] = cVar9 + '\x01';
          lVar13 = (ulong)((int)uVar2 <= (int)puVar12[uVar10 + 1]) + lVar13;
          local_80[lVar13] = cVar9 + '\x02';
          lVar13 = (ulong)((int)uVar2 <= (int)puVar12[uVar10 + 2]) + lVar13;
          local_80[lVar13] = cVar9 + '\x03';
          lVar13 = (ulong)((int)uVar2 <= (int)puVar12[uVar10 + 3]) + lVar13;
          local_80[lVar13] = cVar9 + '\x04';
          lVar13 = (ulong)((int)uVar2 <= (int)puVar12[uVar10 + 4]) + lVar13;
          local_80[lVar13] = cVar9 + '\x05';
          lVar13 = (ulong)((int)uVar2 <= (int)puVar12[uVar10 + 5]) + lVar13;
          local_80[lVar13] = cVar9 + '\x06';
          lVar13 = (ulong)((int)uVar2 <= (int)puVar12[uVar10 + 6]) + lVar13;
          local_80[lVar13] = cVar9 + '\a';
          uVar11 = (ulong)((int)uVar2 <= (int)puVar12[uVar10 + 7]) + lVar13;
          puVar7 = puVar7 + 8;
        }
      }
      if (uVar6 < 0x40) {
        uVar10 = 0;
        while (uVar6 != uVar10) {
          uVar10 = uVar10 + 1;
          local_100[uVar15] = (char)uVar10;
          puVar12 = puVar14 + -1;
          puVar14 = puVar14 + -1;
          uVar15 = uVar15 + ((int)*puVar12 < (int)uVar2);
        }
      }
      else {
        uVar6 = 0;
        while (uVar6 < 0x40) {
          cVar9 = (char)uVar6;
          local_100[uVar15] = cVar9 + '\x01';
          lVar13 = ((int)puVar14[-1] < (int)uVar2) + uVar15;
          local_100[lVar13] = cVar9 + '\x02';
          lVar13 = (ulong)((int)puVar14[-2] < (int)uVar2) + lVar13;
          local_100[lVar13] = cVar9 + '\x03';
          lVar13 = (ulong)((int)puVar14[-3] < (int)uVar2) + lVar13;
          local_100[lVar13] = cVar9 + '\x04';
          lVar13 = (ulong)((int)puVar14[-4] < (int)uVar2) + lVar13;
          local_100[lVar13] = cVar9 + '\x05';
          lVar13 = (ulong)((int)puVar14[-5] < (int)uVar2) + lVar13;
          local_100[lVar13] = cVar9 + '\x06';
          lVar13 = (ulong)((int)puVar14[-6] < (int)uVar2) + lVar13;
          local_100[lVar13] = cVar9 + '\a';
          lVar13 = (ulong)((int)puVar14[-7] < (int)uVar2) + lVar13;
          uVar6 = uVar6 + 8;
          local_100[lVar13] = (char)uVar6;
          puVar12 = puVar14 + -8;
          puVar14 = puVar14 + -8;
          uVar15 = (ulong)((int)*puVar12 < (int)uVar2) + lVar13;
        }
      }
      uVar6 = uVar11;
      if (uVar15 < uVar11) {
        uVar6 = uVar15;
      }
      offsets_l = local_80 + local_180;
      local_180 = local_180 + uVar6;
      _Var4._M_current = first._M_current;
      if (uVar11 <= uVar15) {
        local_180 = 0;
        _Var4._M_current = (int *)puVar7;
      }
      swap_offsets<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                (first,last,offsets_l,local_100 + lVar5,uVar6,uVar11 == uVar15);
      uVar11 = uVar11 - uVar6;
      lVar5 = lVar5 + uVar6;
      uVar15 = uVar15 - uVar6;
      param_3 = extraout_RDX;
      first._M_current = _Var4._M_current;
      puVar12 = puVar7;
      if (uVar15 == 0) {
        lVar5 = 0;
        last._M_current = (int *)puVar14;
      }
    }
    if (uVar11 != 0) {
      while (puVar12 = puVar14, uVar11 != 0) {
        param_3 = (ulong)(&bStack_81)[uVar11 + local_180];
        uVar3 = first._M_current[param_3];
        first._M_current[param_3] = puVar12[-1];
        puVar12[-1] = uVar3;
        uVar11 = uVar11 - 1;
        puVar14 = puVar12 + -1;
      }
    }
    if (uVar15 != 0) {
      while (uVar15 != 0) {
        uVar3 = last._M_current[-(ulong)(&local_101)[uVar15 + lVar5]];
        param_3 = (ulong)uVar3;
        last._M_current[-(ulong)(&local_101)[uVar15 + lVar5]] = *puVar12;
        *puVar12 = uVar3;
        puVar12 = puVar12 + 1;
        uVar15 = uVar15 - 1;
      }
    }
  }
  pVar16._9_7_ = (undefined7)(param_3 >> 8);
  pVar16.second = end <= puVar1;
  *begin = puVar12[-1];
  puVar12[-1] = uVar2;
  pVar16.first._M_current = (int *)(puVar12 + -1);
  return pVar16;
}

Assistant:

inline std::pair<Iter, bool> partition_right_branchless(Iter begin, Iter end, Compare comp) {
        typedef typename std::iterator_traits<Iter>::value_type T;

        // Move pivot into local for speed.
        T pivot(PDQSORT_PREFER_MOVE(*begin));
        Iter first = begin;
        Iter last = end;

        // Find the first element greater than or equal than the pivot (the median of 3 guarantees
        // this exists).
        while (comp(*++first, pivot));

        // Find the first element strictly smaller than the pivot. We have to guard this search if
        // there was no element before *first.
        if (first - 1 == begin) while (first < last && !comp(*--last, pivot));
        else                    while (                !comp(*--last, pivot));

        // If the first pair of elements that should be swapped to partition are the same element,
        // the passed in sequence already was correctly partitioned.
        bool already_partitioned = first >= last;
        if (!already_partitioned) {
            std::iter_swap(first, last);
            ++first;

            // The following branchless partitioning is derived from "BlockQuicksort: How Branch
            // Mispredictions don’t affect Quicksort" by Stefan Edelkamp and Armin Weiss, but
            // heavily micro-optimized.
            unsigned char offsets_l_storage[block_size + cacheline_size];
            unsigned char offsets_r_storage[block_size + cacheline_size];
            unsigned char* offsets_l = align_cacheline(offsets_l_storage);
            unsigned char* offsets_r = align_cacheline(offsets_r_storage);

            Iter offsets_l_base = first;
            Iter offsets_r_base = last;
            size_t num_l, num_r, start_l, start_r;
            num_l = num_r = start_l = start_r = 0;
            
            while (first < last) {
                // Fill up offset blocks with elements that are on the wrong side.
                // First we determine how much elements are considered for each offset block.
                size_t num_unknown = last - first;
                size_t left_split = num_l == 0 ? (num_r == 0 ? num_unknown / 2 : num_unknown) : 0;
                size_t right_split = num_r == 0 ? (num_unknown - left_split) : 0;

                // Fill the offset blocks.
                if (left_split >= block_size) {
                    for (size_t i = 0; i < block_size;) {
                        offsets_l[num_l] = i++; num_l += !comp(*first, pivot); ++first;
                        offsets_l[num_l] = i++; num_l += !comp(*first, pivot); ++first;
                        offsets_l[num_l] = i++; num_l += !comp(*first, pivot); ++first;
                        offsets_l[num_l] = i++; num_l += !comp(*first, pivot); ++first;
                        offsets_l[num_l] = i++; num_l += !comp(*first, pivot); ++first;
                        offsets_l[num_l] = i++; num_l += !comp(*first, pivot); ++first;
                        offsets_l[num_l] = i++; num_l += !comp(*first, pivot); ++first;
                        offsets_l[num_l] = i++; num_l += !comp(*first, pivot); ++first;
                    }
                } else {
                    for (size_t i = 0; i < left_split;) {
                        offsets_l[num_l] = i++; num_l += !comp(*first, pivot); ++first;
                    }
                }

                if (right_split >= block_size) {
                    for (size_t i = 0; i < block_size;) {
                        offsets_r[num_r] = ++i; num_r += comp(*--last, pivot);
                        offsets_r[num_r] = ++i; num_r += comp(*--last, pivot);
                        offsets_r[num_r] = ++i; num_r += comp(*--last, pivot);
                        offsets_r[num_r] = ++i; num_r += comp(*--last, pivot);
                        offsets_r[num_r] = ++i; num_r += comp(*--last, pivot);
                        offsets_r[num_r] = ++i; num_r += comp(*--last, pivot);
                        offsets_r[num_r] = ++i; num_r += comp(*--last, pivot);
                        offsets_r[num_r] = ++i; num_r += comp(*--last, pivot);
                    }
                } else {
                    for (size_t i = 0; i < right_split;) {
                        offsets_r[num_r] = ++i; num_r += comp(*--last, pivot);
                    }
                }

                // Swap elements and update block sizes and first/last boundaries.
                size_t num = std::min(num_l, num_r);
                swap_offsets(offsets_l_base, offsets_r_base,
                             offsets_l + start_l, offsets_r + start_r,
                             num, num_l == num_r);
                num_l -= num; num_r -= num;
                start_l += num; start_r += num;

                if (num_l == 0) {
                    start_l = 0;
                    offsets_l_base = first;
                }
                
                if (num_r == 0) {
                    start_r = 0;
                    offsets_r_base = last;
                }
            }

            // We have now fully identified [first, last)'s proper position. Swap the last elements.
            if (num_l) {
                offsets_l += start_l;
                while (num_l--) std::iter_swap(offsets_l_base + offsets_l[num_l], --last);
                first = last;
            }
            if (num_r) {
                offsets_r += start_r;
                while (num_r--) std::iter_swap(offsets_r_base - offsets_r[num_r], first), ++first;
                last = first;
            }
        }

        // Put the pivot in the right place.
        Iter pivot_pos = first - 1;
        *begin = PDQSORT_PREFER_MOVE(*pivot_pos);
        *pivot_pos = PDQSORT_PREFER_MOVE(pivot);

        return std::make_pair(pivot_pos, already_partitioned);
    }